

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O1

AssertionExpr * slang::ast::bindUnknownPortConn(ASTContext *context,PropertyExprSyntax *syntax)

{
  SyntaxKind kind;
  int *piVar1;
  long lVar2;
  Compilation *compilation;
  SyntaxNode *syntax_00;
  Scope *args;
  Type *args_2;
  undefined8 args_1;
  bool bVar3;
  uint uVar4;
  int iVar5;
  SyntaxNode **ppSVar6;
  ArbitrarySymbolExpression *args_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Symbol *symbol;
  SimpleAssertionExpr *unaff_R13;
  HierarchicalReference hierRef;
  LookupResult result;
  HierarchicalReference *local_2b8;
  SourceRange local_2b0;
  HierarchicalReference local_2a0;
  undefined1 local_278 [240];
  Element *local_188;
  size_type local_180;
  size_type local_178;
  Element local_170 [2];
  SmallVectorBase<slang::Diagnostic> local_130;
  
  if (((syntax->super_SyntaxNode).kind != SimplePropertyExpr) ||
     (piVar1 = *(int **)&syntax[1].super_SyntaxNode, *piVar1 != 0x1b1)) goto LAB_00796a11;
  lVar2 = *(long *)(piVar1 + 8);
  if (lVar2 == 0) {
    compilation = ((context->scope).ptr)->compilation;
    ppSVar6 = (SyntaxNode **)(piVar1 + 6);
    do {
      syntax_00 = *ppSVar6;
      kind = (((ExpressionSyntax *)&syntax_00->kind)->super_SyntaxNode).kind;
      ppSVar6 = &(((NameSyntax *)(syntax_00 + 1))->super_ExpressionSyntax).super_SyntaxNode.
                 previewNode;
    } while (kind == ParenthesizedExpression);
    bVar3 = slang::syntax::NameSyntax::isKind(kind);
    if (bVar3) {
      local_278._24_8_ = local_278 + 0x30;
      local_278._0_8_ = (Symbol *)0x0;
      local_278._8_5_ = 0;
      local_278._13_3_ = 0;
      local_278._16_4_ = 0;
      local_278[0x14] = '\0';
      local_278._32_8_ = (TempVarSymbol *)0x0;
      local_278._40_8_ = (RandomizeDetails *)0x4;
      local_188 = local_170;
      local_180 = 0;
      local_178 = 2;
      local_130.data_ = (pointer)local_130.firstElement;
      local_130.len = 0;
      local_130.cap = 2;
      args_00 = (ArbitrarySymbolExpression *)context;
      Lookup::name((NameSyntax *)syntax_00,context,(bitmask<slang::ast::LookupFlags>)0x0,
                   (LookupResult *)local_278);
      args_1 = local_278._0_8_;
      bVar3 = true;
      if ((((Symbol *)local_278._0_8_ != (Symbol *)0x0) &&
          (uVar4 = *(SymbolKind *)(Compilation **)local_278._0_8_ - InterfacePort, uVar4 < 0x1b)) &&
         ((0x4000053U >> (uVar4 & 0x1f) & 1) != 0)) {
        HierarchicalReference::fromLookup(&local_2a0,compilation,(LookupResult *)local_278);
        args = (context->scope).ptr;
        args_2 = compilation->voidType;
        local_2b8 = &local_2a0;
        local_2b0 = slang::syntax::SyntaxNode::sourceRange(&syntax->super_SyntaxNode);
        args_00 = BumpAllocator::
                  emplace<slang::ast::ArbitrarySymbolExpression,slang::ast::Scope_const&,slang::ast::Symbol_const&,slang::ast::Type_const&,slang::ast::HierarchicalReference*,slang::SourceRange>
                            (&compilation->super_BumpAllocator,args,(Symbol *)args_1,args_2,
                             &local_2b8,&local_2b0);
        unaff_R13 = BumpAllocator::
                    emplace<slang::ast::SimpleAssertionExpr,slang::ast::ArbitrarySymbolExpression&,std::nullopt_t_const&>
                              (&compilation->super_BumpAllocator,args_00,(nullopt_t *)&std::nullopt)
        ;
        bVar3 = false;
      }
      SmallVectorBase<slang::Diagnostic>::cleanup(&local_130,(EVP_PKEY_CTX *)args_00);
      if (local_188 != local_170) {
        operator_delete(local_188);
      }
      if ((Symbol *)local_278._24_8_ != (Symbol *)(local_278 + 0x30)) {
        operator_delete((void *)local_278._24_8_);
      }
      if (!bVar3) goto LAB_00796a0c;
    }
    iVar5 = Expression::bind((int)syntax_00,(sockaddr *)context,0x280);
    unaff_R13 = BumpAllocator::
                emplace<slang::ast::SimpleAssertionExpr,slang::ast::Expression_const&,std::nullopt_t_const&>
                          (&compilation->super_BumpAllocator,
                           (Expression *)CONCAT44(extraout_var,iVar5),(nullopt_t *)&std::nullopt);
  }
LAB_00796a0c:
  if (lVar2 == 0) {
    return &unaff_R13->super_AssertionExpr;
  }
LAB_00796a11:
  ASTContext::resetFlags((ASTContext *)local_278,context,(bitmask<slang::ast::ASTFlags>)0x40280);
  iVar5 = AssertionExpr::bind((AssertionExpr *)syntax,(int)(ASTContext *)local_278,(sockaddr *)0x0,0
                             );
  return (AssertionExpr *)CONCAT44(extraout_var_00,iVar5);
}

Assistant:

static const AssertionExpr* bindUnknownPortConn(const ASTContext& context,
                                                const PropertyExprSyntax& syntax) {
    // We have to check for a simple reference to an interface instance or port here,
    // since we don't know whether this is an interface port connection or even
    // a normal connection with a virtual interface type.
    const auto flags = ASTFlags::AllowUnboundedLiteral | ASTFlags::StreamingAllowed;
    const SyntaxNode* node = &syntax;
    if (node->kind == SyntaxKind::SimplePropertyExpr) {
        node = node->as<SimplePropertyExprSyntax>().expr;
        if (node->kind == SyntaxKind::SimpleSequenceExpr) {
            auto& simpSeq = node->as<SimpleSequenceExprSyntax>();
            if (!simpSeq.repetition) {
                auto& comp = context.getCompilation();
                const ExpressionSyntax* expr = simpSeq.expr;
                while (expr->kind == SyntaxKind::ParenthesizedExpression)
                    expr = expr->as<ParenthesizedExpressionSyntax>().expression;

                if (NameSyntax::isKind(expr->kind)) {
                    LookupResult result;
                    Lookup::name(expr->as<NameSyntax>(), context, LookupFlags::None, result);
                    if (result.found) {
                        auto symbol = result.found;
                        if (symbol->kind == SymbolKind::Modport ||
                            symbol->kind == SymbolKind::InterfacePort ||
                            symbol->kind == SymbolKind::Instance ||
                            symbol->kind == SymbolKind::InstanceArray ||
                            symbol->kind == SymbolKind::UninstantiatedDef) {

                            auto hierRef = HierarchicalReference::fromLookup(comp, result);
                            auto hre = comp.emplace<ArbitrarySymbolExpression>(
                                *context.scope, *symbol, comp.getVoidType(), &hierRef,
                                syntax.sourceRange());

                            return comp.emplace<SimpleAssertionExpr>(*hre, std::nullopt);
                        }
                    }
                }

                return comp.emplace<SimpleAssertionExpr>(Expression::bind(*expr, context, flags),
                                                         std::nullopt);
            }
        }
    }

    return &AssertionExpr::bind(syntax,
                                context.resetFlags(ASTFlags::AssertionInstanceArgCheck | flags));
}